

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser_test.cc
# Opt level: O2

void __thiscall
DyndepParserTestMissingVersionOtherVar::Run(DyndepParserTestMissingVersionOtherVar *this)

{
  Test *pTVar1;
  bool bVar2;
  string err;
  char kInput [30];
  DyndepParser parser;
  allocator<char> local_139;
  string local_138;
  string local_118;
  char local_f8 [32];
  DyndepParser local_d8;
  
  builtin_strncpy(local_f8 + 0x10,"_version = 1\n",0xe);
  builtin_strncpy(local_f8,"not_ninja_dyndep",0x10);
  DyndepParser::DyndepParser
            (&local_d8,&(this->super_DyndepParserTest).state_,
             (FileReader *)&(this->super_DyndepParserTest).fs_,
             &(this->super_DyndepParserTest).dyndep_file_);
  pTVar1 = g_current_test;
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  local_138._M_string_length = 0;
  local_138.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,local_f8,&local_139);
  bVar2 = DyndepParser::ParseTest(&local_d8,&local_118,&local_138);
  testing::Test::Check
            (pTVar1,!bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
             ,0x99,"parser.ParseTest(kInput, &err)");
  std::__cxx11::string::~string((string *)&local_118);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("input:1: expected \'ninja_dyndep_version = ...\'\nnot_ninja_dyndep_version = 1\n                            ^ near here"
                          ,&local_138);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
             ,0x9c,
             "\"input:1: expected \'ninja_dyndep_version = ...\'\\n\" \"not_ninja_dyndep_version = 1\\n\" \"                            ^ near here\" == err"
            );
  std::__cxx11::string::~string((string *)&local_138);
  DyndepParser::~DyndepParser(&local_d8);
  return;
}

Assistant:

TEST_F(DyndepParserTest, MissingVersionOtherVar) {
  const char kInput[] =
"not_ninja_dyndep_version = 1\n";
  DyndepParser parser(&state_, &fs_, &dyndep_file_);
  string err;
  EXPECT_FALSE(parser.ParseTest(kInput, &err));
  EXPECT_EQ("input:1: expected 'ninja_dyndep_version = ...'\n"
            "not_ninja_dyndep_version = 1\n"
            "                            ^ near here", err);
}